

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVec.cpp
# Opt level: O3

float calculateEuclideanDistance(FeatureVec *a,FeatureVec *b)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pfVar1 = (a->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (a->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pfVar2 - (long)pfVar1;
  pfVar3 = (b->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar4 != (long)(b->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar3) {
    __assert_fail("a.size() == b.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-km/src/utils/FeatureVec.cpp"
                  ,0x2b,"float calculateEuclideanDistance(FeatureVec, FeatureVec)");
  }
  if (pfVar2 == pfVar1) {
    auVar7 = ZEXT816(0);
  }
  else {
    lVar4 = lVar4 >> 2;
    auVar7 = ZEXT816(0);
    lVar5 = 0;
    do {
      auVar8._0_8_ = (double)(pfVar1[lVar5] - pfVar3[lVar5]);
      auVar8._8_8_ = 0;
      auVar6._0_8_ = (double)auVar7._0_4_;
      auVar6._8_8_ = auVar7._8_8_;
      auVar6 = vfmadd231sd_fma(auVar6,auVar8,auVar8);
      auVar7._0_4_ = (float)auVar6._0_8_;
      auVar7._4_12_ = auVar6._4_12_;
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  return auVar7._0_4_;
}

Assistant:

float calculateEuclideanDistance(FeatureVec a, FeatureVec b) {
  assert(a.size() == b.size());
  float dist = 0.0f;
  // Loop over all features
  for (size_t f = 0; f < a.size(); f++) {
    // Accumulate the squared difference
    dist += std::pow(a[f] - b[f], 2);
  }
  // Return the square root
  return std::sqrt(dist);
}